

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isPossibleDelayOrEventControl(TokenKind kind)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  uVar1 = CONCAT22(in_register_0000003a,kind) - 0x2e;
  if (((0x29 < uVar1) || ((0x20000000003U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (CONCAT22(in_register_0000003a,kind) != 0x104)) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossibleDelayOrEventControl(TokenKind kind) {
    switch (kind) {
        case TokenKind::Hash:
        case TokenKind::DoubleHash:
        case TokenKind::At:
        case TokenKind::RepeatKeyword:
            return true;
        default:
            return false;
    }
}